

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext *ctx,ExprSequence *node)

{
  uint uVar1;
  ExprBase **ppEVar2;
  LLVMValueRef pLVar3;
  uint local_24;
  LLVMValueRef pLStack_20;
  uint i;
  LLVMValueRef result;
  ExprSequence *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLStack_20 = (LLVMValueRef)0x0;
  local_24 = 0;
  while( true ) {
    uVar1 = SmallArray<ExprBase_*,_4U>::size(&node->expressions);
    if (uVar1 <= local_24) break;
    ppEVar2 = SmallArray<ExprBase_*,_4U>::operator[](&node->expressions,local_24);
    pLStack_20 = CompileLlvm(ctx,*ppEVar2);
    local_24 = local_24 + 1;
  }
  pLVar3 = CheckType(ctx,&node->super_ExprBase,pLStack_20);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext &ctx, ExprSequence *node)
{
	LLVMValueRef result = NULL;

	for(unsigned i = 0; i < node->expressions.size(); i++)
		result = CompileLlvm(ctx, node->expressions[i]);

	return CheckType(ctx, node, result);
}